

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

AST * jsonnet::internal::left_recursive(AST *ast_)

{
  long lVar1;
  AST *pAVar2;
  
  if (ast_ == (AST *)0x0) {
    pAVar2 = (AST *)0x0;
  }
  else {
    lVar1 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo,0);
    if ((((lVar1 == 0) &&
         (lVar1 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo,0), lVar1 == 0)) &&
        (lVar1 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo,0), lVar1 == 0)) &&
       ((lVar1 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo,0), lVar1 == 0 &&
        (lVar1 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo,0), lVar1 == 0)))) {
      return (AST *)0x0;
    }
    pAVar2 = *(AST **)(lVar1 + 0x80);
  }
  return pAVar2;
}

Assistant:

static AST *left_recursive(AST *ast_)
{
    if (auto *ast = dynamic_cast<Apply *>(ast_))
        return ast->target;
    if (auto *ast = dynamic_cast<ApplyBrace *>(ast_))
        return ast->left;
    if (auto *ast = dynamic_cast<Binary *>(ast_))
        return ast->left;
    if (auto *ast = dynamic_cast<Index *>(ast_))
        return ast->target;
    if (auto *ast = dynamic_cast<InSuper *>(ast_))
        return ast->element;
    return nullptr;
}